

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# untyped_message.h
# Opt level: O2

Span<const_google::protobuf::json_internal::UntypedMessage::Bool> __thiscall
google::protobuf::json_internal::UntypedMessage::
Get<google::protobuf::json_internal::UntypedMessage::Bool>
          (UntypedMessage *this,int32_t field_number)

{
  bool bVar1;
  variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>
  *pvVar2;
  pointer prVar3;
  LogMessage *pLVar4;
  size_type sVar5;
  Span<const_google::protobuf::json_internal::UntypedMessage::Bool> SVar6;
  int32_t field_number_local;
  iterator local_28;
  const_iterator it;
  
  field_number_local = field_number;
  it.inner_ = absl::lts_20240722::container_internal::raw_hash_set<$2385b75b$>::find<int>
                        ((raw_hash_set<_2385b75b_> *)&this->fields_,&field_number_local);
  local_28.ctrl_ = (ctrl_t *)0x0;
  bVar1 = absl::lts_20240722::container_internal::operator==(&it.inner_,&local_28);
  sVar5 = 0;
  pvVar2 = (variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>
            *)0x0;
  if (!bVar1) {
    prVar3 = absl::lts_20240722::container_internal::raw_hash_set<$2385b75b$>::iterator::operator->
                       (&it.inner_);
    if (*(__index_type *)
         ((long)&(prVar3->second).
                 super__Variant_base<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>
                 .
                 super__Move_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                 .
                 super__Copy_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                 .
                 super__Move_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                 .
                 super__Copy_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                 .
                 super__Variant_storage_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
         + 0x28) == '\0') {
      pvVar2 = &prVar3->second;
      sVar5 = 1;
    }
    else {
      prVar3 = absl::lts_20240722::container_internal::raw_hash_set<$2385b75b$>::iterator::
               operator->(&it.inner_);
      if (*(__index_type *)
           ((long)&(prVar3->second).
                   super__Variant_base<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>
                   .
                   super__Move_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                   .
                   super__Copy_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                   .
                   super__Move_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                   .
                   super__Copy_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                   .
                   super__Variant_storage_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
           + 0x28) != '\t') {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_28,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/json/internal/untyped_message.h"
                   ,0xc9,5,"false");
        pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<
                           ((LogMessage *)&local_28,
                            (char (*) [36])"wrong type for UntypedMessage::Get(");
        pLVar4 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar4,field_number_local)
        ;
        absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar4,(char (*) [2])0x349149);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_28);
      }
      pvVar2 = *(variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>
                 **)&(prVar3->second).
                     super__Variant_base<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>
                     .
                     super__Move_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                     .
                     super__Copy_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                     .
                     super__Move_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                     .
                     super__Copy_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                     .
                     super__Variant_storage_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                     ._M_u;
      sVar5 = *(long *)((long)&(prVar3->second).
                               super__Variant_base<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>
                               .
                               super__Move_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                               .
                               super__Copy_assign_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                               .
                               super__Move_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                               .
                               super__Copy_ctor_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                               .
                               super__Variant_storage_alias<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool>,_std::vector<int>,_std::vector<unsigned_int>,_std::vector<long>,_std::vector<unsigned_long>,_std::vector<float>,_std::vector<double>,_std::vector<std::__cxx11::basic_string<char>_>,_std::vector<google::protobuf::json_internal::UntypedMessage>_>
                       + 8) - (long)pvVar2;
    }
  }
  SVar6.len_ = sVar5;
  SVar6.ptr_ = (pointer)pvVar2;
  return SVar6;
}

Assistant:

absl::Span<const T> Get(int32_t field_number) const {
    auto it = fields_.find(field_number);
    if (it == fields_.end()) {
      return {};
    }

    if (auto* val = absl::get_if<T>(&it->second)) {
      return absl::Span<const T>(val, 1);
    } else if (auto* vec = absl::get_if<std::vector<T>>(&it->second)) {
      return *vec;
    } else {
      ABSL_CHECK(false) << "wrong type for UntypedMessage::Get(" << field_number
                        << ")";
      return {};  // avoid compiler warning.
    }
  }